

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeSolutionHDivT<double>
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZMaterialDataT<double> *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  TPZCompMesh *pTVar5;
  TPZFMatrix<double> *this_00;
  int64_t iVar6;
  TPZManVector<double,_10> *pTVar7;
  TPZFNMatrix<30,_double> *pTVar8;
  int64_t iVar9;
  int64_t iVar10;
  int64_t iVar11;
  TPZFNMatrix<9,_double> *pTVar12;
  Fad<double> *pFVar13;
  double *pdVar14;
  TPZGeoEl *pTVar15;
  TPZConnect *this_01;
  long in_RSI;
  long *in_RDI;
  double dVar16;
  int kdim;
  int ilinha;
  int i_2;
  TPZManVector<double,_3> normal;
  REAL phival;
  double meshsol;
  int idf;
  int64_t is_1;
  int ish;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  int in;
  int nshapeV;
  int counter;
  int ivec;
  int ishape;
  TPZBlock *block;
  int j;
  int i_1;
  int s_1;
  int gel_dim;
  TPZGeoEl *ref;
  TPZFNMatrix<4,_double> Grad0;
  int s;
  int e;
  int i;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  TPZFNMatrix<3,_double> Normalvec;
  int normvecCols;
  int normvecRows;
  TPZFMatrix<double> GradOfPhiHdiv;
  int64_t is;
  int64_t numbersol;
  TPZFMatrix<double> *MeshSol;
  int ncon;
  int nstate;
  int dim;
  TPZFMatrix<double> *in_stack_ffffffffffffeb58;
  TPZSolutionMatrix *in_stack_ffffffffffffeb60;
  TPZCompEl *in_stack_ffffffffffffeb68;
  TPZManVector<TPZFNMatrix<9,_double>,_18> *in_stack_ffffffffffffeb70;
  double *in_stack_ffffffffffffeb78;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffeb80;
  double *in_stack_ffffffffffffeb88;
  double dVar17;
  int64_t in_stack_ffffffffffffeb90;
  int64_t in_stack_ffffffffffffeb98;
  TPZFNMatrix<4,_double> *in_stack_ffffffffffffeba0;
  double *in_stack_ffffffffffffeba8;
  TPZVec<double> *in_stack_ffffffffffffebb0;
  int64_t in_stack_ffffffffffffebf8;
  TPZManVector<TPZFNMatrix<9,_double>,_18> *in_stack_ffffffffffffec00;
  int64_t in_stack_ffffffffffffec28;
  TPZManVector<TPZFNMatrix<30,_double>,_20> *in_stack_ffffffffffffec30;
  int local_131c;
  int local_1318;
  int local_1314;
  TPZVec<double> local_1310;
  double local_12d8;
  double local_12d0;
  int local_12c4;
  TPZCompEl *in_stack_ffffffffffffed40;
  long index;
  int local_12b4;
  int local_128c;
  int local_1280;
  int local_1270;
  int local_126c;
  int local_1268;
  int local_1194;
  int local_1190;
  int local_118c;
  TPZVec<TPZFNMatrix<9,_double>_> local_1188 [8];
  size_t in_stack_ffffffffffffef78;
  char *in_stack_ffffffffffffef80;
  int64_t local_38;
  
  plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
  iVar1 = (**(code **)(*plVar4 + 0x78))();
  iVar2 = (**(code **)(*in_RDI + 0x90))();
  pTVar5 = TPZCompEl::Mesh(in_stack_ffffffffffffed40);
  TPZCompMesh::Solution(pTVar5);
  this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffeb60);
  iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)this_00);
  if (iVar6 != 1) {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  }
  TPZManVector<TPZManVector<double,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<double,_10>,_20> *)in_stack_ffffffffffffec30,
             in_stack_ffffffffffffec28);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize
            (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
  TPZManVector<TPZManVector<double,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<double,_10>,_20> *)in_stack_ffffffffffffec30,
             in_stack_ffffffffffffec28);
  for (local_38 = 0; local_38 < iVar6; local_38 = local_38 + 1) {
    pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[]
                       ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0),local_38);
    (*(pTVar7->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar7,(long)(iVar1 * 3));
    TPZVec<TPZManVector<double,_10>_>::operator[]
              ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0),local_38);
    TPZVec<double>::Fill
              (in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8,
               (int64_t)in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
    pTVar8 = TPZVec<TPZFNMatrix<30,_double>_>::operator[]
                       ((TPZVec<TPZFNMatrix<30,_double>_> *)(in_RSI + 0x51b0),local_38);
    (*(pTVar8->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar8,(long)(iVar1 * 3),3);
    pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[]
                       ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x7070),local_38);
    (*(pTVar7->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar7,(long)iVar1);
    TPZVec<TPZManVector<double,_10>_>::operator[]
              ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x7070),local_38);
    TPZVec<double>::Fill
              (in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8,
               (int64_t)in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  }
  TPZFMatrix<double>::TPZFMatrix
            (&in_stack_ffffffffffffeba0->super_TPZFMatrix<double>,in_stack_ffffffffffffeb98,
             in_stack_ffffffffffffeb90);
  TPZFMatrix<double>::Zero((TPZFMatrix<double> *)in_stack_ffffffffffffeb60);
  iVar9 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RSI + 0x4420));
  iVar10 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RSI + 0x4420));
  TPZFNMatrix<3,_double>::TPZFNMatrix
            ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98,
             in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8);
  local_118c = 0;
  while( true ) {
    iVar11 = TPZVec<TPZFNMatrix<9,_double>_>::size(local_1188);
    if (iVar11 <= local_118c) break;
    pTVar12 = TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1188,(long)local_118c);
    (*(pTVar12->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar12,3);
    local_118c = local_118c + 1;
  }
  if ((*(byte *)(in_RSI + 0x38fc) & 1) == 0) {
    TPZFNMatrix<3,_double>::operator=
              ((TPZFNMatrix<3,_double> *)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  }
  else {
    pzinternal::DebugStopImpl(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    for (local_1190 = 0; local_1190 < (int)iVar9; local_1190 = local_1190 + 1) {
      for (local_1194 = 0; local_1194 < (int)iVar10; local_1194 = local_1194 + 1) {
        pFVar13 = TPZFMatrix<Fad<double>_>::operator()
                            (in_stack_ffffffffffffeb80,(int64_t)in_stack_ffffffffffffeb78,
                             (int64_t)in_stack_ffffffffffffeb70);
        pdVar14 = Fad<double>::val(pFVar13);
        dVar17 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                             (int64_t)in_stack_ffffffffffffeb78,(int64_t)in_stack_ffffffffffffeb70);
        *pdVar14 = dVar17;
      }
    }
    TPZFNMatrix<4,_double>::TPZFNMatrix
              (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,
               in_stack_ffffffffffffeb88);
    pTVar15 = TPZCompEl::Reference(in_stack_ffffffffffffeb68);
    iVar3 = (**(code **)(*(long *)pTVar15 + 0x210))();
    for (local_1268 = 0; local_1268 < (int)iVar10; local_1268 = local_1268 + 1) {
      for (local_126c = 0; local_126c < iVar3; local_126c = local_126c + 1) {
        for (local_1270 = 0; local_1270 < iVar3; local_1270 = local_1270 + 1) {
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_ffffffffffffeb80,(int64_t)in_stack_ffffffffffffeb78,
                     (int64_t)in_stack_ffffffffffffeb70);
          pdVar14 = Fad<double>::fastAccessDx
                              ((Fad<double> *)in_stack_ffffffffffffeb60,
                               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20));
          dVar17 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                               (int64_t)in_stack_ffffffffffffeb78,(int64_t)in_stack_ffffffffffffeb70
                              );
          *pdVar14 = dVar17;
        }
      }
      TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1188,(long)local_1268);
      TPZFNMatrix<9,_double>::operator=
                ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
    }
    TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x19fa4a0);
  }
  pTVar5 = TPZCompEl::Mesh(in_stack_ffffffffffffed40);
  TPZCompMesh::Block(pTVar5);
  local_1280 = 0;
  TPZVec<std::pair<int,_long>_>::NElements((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x42c0));
  for (local_128c = 0; local_128c < iVar2; local_128c = local_128c + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_128c);
    TPZConnect::SequenceNumber(this_01);
    iVar3 = TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffeb60,
                           (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20));
    TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffeb60,
                       (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20));
    local_12b4 = 0;
    while( true ) {
      if (iVar3 / iVar1 <= local_12b4) break;
      for (index = 0; index < iVar6; index = index + 1) {
        for (local_12c4 = 0; local_12c4 < iVar1; local_12c4 = local_12c4 + 1) {
          pdVar14 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                               (int64_t)in_stack_ffffffffffffeb78,(int64_t)in_stack_ffffffffffffeb70
                              );
          local_12d0 = *pdVar14;
          pdVar14 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                               (int64_t)in_stack_ffffffffffffeb78,(int64_t)in_stack_ffffffffffffeb70
                              );
          local_12d8 = *pdVar14;
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffeb80,
                     (int64_t)in_stack_ffffffffffffeb78);
          for (local_1314 = 0; local_1314 < 3; local_1314 = local_1314 + 1) {
            if ((*(byte *)(in_RSI + 0x38fc) & 1) == 0) {
              pdVar14 = TPZFMatrix<double>::operator()
                                  ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                                   (int64_t)in_stack_ffffffffffffeb78,
                                   (int64_t)in_stack_ffffffffffffeb70);
              dVar17 = *pdVar14;
              pdVar14 = TPZVec<double>::operator[](&local_1310,(long)local_1314);
              *pdVar14 = dVar17;
            }
            else {
              pFVar13 = TPZFMatrix<Fad<double>_>::operator()
                                  (in_stack_ffffffffffffeb80,(int64_t)in_stack_ffffffffffffeb78,
                                   (int64_t)in_stack_ffffffffffffeb70);
              pdVar14 = Fad<double>::val(pFVar13);
              dVar17 = *pdVar14;
              pdVar14 = TPZVec<double>::operator[](&local_1310,(long)local_1314);
              *pdVar14 = dVar17;
            }
          }
          pdVar14 = TPZFMatrix<double>::operator()
                              ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                               (int64_t)in_stack_ffffffffffffeb78,(int64_t)in_stack_ffffffffffffeb70
                              );
          dVar16 = local_12d0;
          dVar17 = *pdVar14;
          pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[]
                             ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x7070),index);
          pdVar14 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,(long)local_12c4);
          *pdVar14 = dVar17 * dVar16 + *pdVar14;
          for (local_1318 = 0; local_1318 < 3; local_1318 = local_1318 + 1) {
            pdVar14 = TPZVec<double>::operator[](&local_1310,(long)local_1318);
            dVar17 = local_12d0;
            dVar16 = *pdVar14 * local_12d8;
            pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[]
                               ((TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0),index);
            pdVar14 = TPZVec<double>::operator[]
                                (&pTVar7->super_TPZVec<double>,(long)(local_1318 + local_12c4 * 3));
            *pdVar14 = dVar16 * dVar17 + *pdVar14;
            for (local_131c = 0; local_131c < 3; local_131c = local_131c + 1) {
              dVar16 = local_12d0;
              pdVar14 = TPZFMatrix<double>::operator()
                                  ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                                   (int64_t)in_stack_ffffffffffffeb78,
                                   (int64_t)in_stack_ffffffffffffeb70);
              dVar17 = *pdVar14;
              TPZVec<TPZFNMatrix<30,_double>_>::operator[]
                        ((TPZVec<TPZFNMatrix<30,_double>_> *)(in_RSI + 0x51b0),index);
              pdVar14 = TPZFMatrix<double>::operator()
                                  ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                                   (int64_t)in_stack_ffffffffffffeb78,
                                   (int64_t)in_stack_ffffffffffffeb70);
              *pdVar14 = dVar16 * dVar17 + *pdVar14;
              if ((*(byte *)(in_RSI + 0x38fc) & 1) != 0) {
                dVar17 = local_12d0;
                TPZVec<TPZFNMatrix<9,_double>_>::operator[](local_1188,(long)local_1280);
                in_stack_ffffffffffffeb80 =
                     (TPZFMatrix<Fad<double>_> *)
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                                (int64_t)in_stack_ffffffffffffeb78,
                                (int64_t)in_stack_ffffffffffffeb70);
                in_stack_ffffffffffffeb70 =
                     (TPZManVector<TPZFNMatrix<9,_double>,_18> *)
                     (dVar17 * (double)(((TPZMatrix<double> *)
                                        &in_stack_ffffffffffffeb80->super_TPZMatrix<Fad<double>_>)->
                                       super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable);
                in_stack_ffffffffffffeb78 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                                (int64_t)in_stack_ffffffffffffeb78,
                                (int64_t)in_stack_ffffffffffffeb70);
                in_stack_ffffffffffffeb60 = (TPZSolutionMatrix *)*in_stack_ffffffffffffeb78;
                TPZVec<TPZFNMatrix<30,_double>_>::operator[]
                          ((TPZVec<TPZFNMatrix<30,_double>_> *)(in_RSI + 0x51b0),index);
                in_stack_ffffffffffffeb58 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffeb80,
                                (int64_t)in_stack_ffffffffffffeb78,
                                (int64_t)in_stack_ffffffffffffeb70);
                (in_stack_ffffffffffffeb58->super_TPZMatrix<double>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffeb70 * (double)in_stack_ffffffffffffeb60 +
                     (double)(in_stack_ffffffffffffeb58->super_TPZMatrix<double>).
                             super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
              }
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffeb60);
        }
      }
      local_1280 = local_1280 + 1;
      local_12b4 = local_12b4 + 1;
    }
  }
  TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(in_stack_ffffffffffffeb70);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x19face3);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x19facf0);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}